

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  
  copy_suite::run();
  count_suite::run();
  fill_suite::run();
  find_suite::run();
  predicate_suite::run();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    copy_suite::run();
    count_suite::run();
    fill_suite::run();
    find_suite::run();
    predicate_suite::run();

    return boost::report_errors();
}